

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O3

ArrayPtr<const_capnp::word> __thiscall
capnp::anon_unknown_0::AsyncMessageReader::getSegment(AsyncMessageReader *this,uint id)

{
  word *pwVar1;
  DirectWireValue<unsigned_int> *pDVar2;
  ulong uVar3;
  ArrayPtr<const_capnp::word> AVar4;
  
  pwVar1 = (word *)0x0;
  uVar3 = 0;
  if (id < *(int *)&(this->super_MessageReader).field_0xd4 + 1U) {
    pDVar2 = (this->moreSizes).ptr + (id - 1);
    if (id == 0) {
      pDVar2 = (DirectWireValue<unsigned_int> *)&this->field_0xd8;
    }
    uVar3 = (ulong)pDVar2->value;
    pwVar1 = (this->segmentStarts).ptr[id];
  }
  AVar4.size_ = uVar3;
  AVar4.ptr = pwVar1;
  return AVar4;
}

Assistant:

kj::ArrayPtr<const word> getSegment(uint id) override {
    if (id >= segmentCount()) {
      return nullptr;
    } else {
      uint32_t size = id == 0 ? segment0Size() : moreSizes[id - 1].get();
      return kj::arrayPtr(segmentStarts[id], size);
    }
  }